

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::JoinHashTable::ScanStructure::ConstructMarkJoinResult
          (ScanStructure *this,DataChunk *join_keys,DataChunk *child,DataChunk *result)

{
  ulong *puVar1;
  data_ptr_t pdVar2;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  idx_t iVar5;
  _Head_base<0UL,_bool_*,_false> _Var6;
  byte bVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  SelectionVector *pSVar10;
  data_ptr_t pdVar11;
  reference pvVar12;
  reference pvVar13;
  ulong uVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  idx_t iVar16;
  size_type __n;
  idx_t i_1;
  idx_t i;
  size_type __n_00;
  ulong uVar17;
  ScanStructure *pSVar18;
  reference rVar19;
  UnifiedVectorFormat jdata;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  ScanStructure *local_90;
  buffer_ptr<ValidityBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  result->count = child->count;
  local_90 = this;
  if ((child->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (child->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n_00 = 0;
    do {
      pvVar12 = vector<duckdb::Vector,_true>::operator[](&result->data,__n_00);
      pvVar13 = vector<duckdb::Vector,_true>::operator[](&child->data,__n_00);
      Vector::Reference(pvVar12,pvVar13);
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)(((long)(child->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(child->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  pvVar12 = vector<duckdb::Vector,_true>::back(&result->data);
  Vector::SetVectorType(pvVar12,FLAT_VECTOR);
  pdVar2 = pvVar12->data;
  FlatVector::VerifyFlatVector(pvVar12);
  pSVar18 = local_90;
  if ((join_keys->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (join_keys->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_88 = &(pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    __n = 0;
    do {
      rVar19 = vector<bool,_true>::get<true>(&pSVar18->ht->null_values_are_equal,__n);
      if ((*rVar19._M_p & rVar19._M_mask) == 0) {
        UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
        pvVar13 = vector<duckdb::Vector,_true>::operator[](&join_keys->data,__n);
        Vector::ToUnifiedFormat(pvVar13,join_keys->count,&local_78);
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
             (unsigned_long *)0x0) && (join_keys->count != 0)) {
          uVar17 = 0;
          do {
            _Var3._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&(local_78.sel)->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            uVar14 = uVar17;
            if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                _Var3._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0)
            {
              uVar14 = (ulong)*(uint *)((long)_Var3._M_t.
                                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                              .super__Head_base<0UL,_unsigned_long_*,_false>.
                                              _M_head_impl + uVar17 * 4);
            }
            if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
              if ((pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_80 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_a8,&local_80);
                p_Var9 = p_Stack_a0;
                peVar8 = local_a8;
                local_a8 = (element_type *)0x0;
                p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var4 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar8;
                (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var9;
                if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                }
                if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
                }
                pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_88);
                (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar15->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar7 = (byte)uVar17 & 0x3f;
              puVar1 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                       + (uVar17 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < join_keys->count);
        }
        if (local_78.owned_sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.owned_sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        pSVar18 = local_90;
        if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(join_keys->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(join_keys->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  iVar5 = child->count;
  if (iVar5 != 0) {
    _Var6._M_head_impl =
         (pSVar18->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    iVar16 = 0;
    do {
      pdVar2[iVar16] = _Var6._M_head_impl[iVar16];
      iVar16 = iVar16 + 1;
    } while (iVar5 != iVar16);
  }
  if ((pSVar18->ht->has_null == true) && (child->count != 0)) {
    uVar17 = 0;
    do {
      if (pdVar2[uVar17] == '\0') {
        if ((pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_a8 = (element_type *)
                     (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,(unsigned_long *)&local_a8);
          pdVar11 = local_78.data;
          pSVar10 = local_78.sel;
          local_78.sel = (SelectionVector *)0x0;
          local_78.data = (data_ptr_t)0x0;
          p_Var4 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar10;
          (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar11;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
          }
          pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar15->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar7 = (byte)uVar17 & 0x3f;
        puVar1 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar17 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < child->count);
  }
  return;
}

Assistant:

void ScanStructure::ConstructMarkJoinResult(DataChunk &join_keys, DataChunk &child, DataChunk &result) {
	// for the initial set of columns we just reference the left side
	result.SetCardinality(child);
	for (idx_t i = 0; i < child.ColumnCount(); i++) {
		result.data[i].Reference(child.data[i]);
	}
	auto &mark_vector = result.data.back();
	mark_vector.SetVectorType(VectorType::FLAT_VECTOR);
	// first we set the NULL values from the join keys
	// if there is any NULL in the keys, the result is NULL
	auto bool_result = FlatVector::GetData<bool>(mark_vector);
	auto &mask = FlatVector::Validity(mark_vector);
	for (idx_t col_idx = 0; col_idx < join_keys.ColumnCount(); col_idx++) {
		if (ht.null_values_are_equal[col_idx]) {
			continue;
		}
		UnifiedVectorFormat jdata;
		join_keys.data[col_idx].ToUnifiedFormat(join_keys.size(), jdata);
		if (!jdata.validity.AllValid()) {
			for (idx_t i = 0; i < join_keys.size(); i++) {
				auto jidx = jdata.sel->get_index(i);
				if (!jdata.validity.RowIsValidUnsafe(jidx)) {
					mask.SetInvalid(i);
				}
			}
		}
	}
	// now set the remaining entries to either true or false based on whether a match was found
	D_ASSERT(found_match);
	for (idx_t i = 0; i < child.size(); i++) {
		bool_result[i] = found_match[i];
	}
	// if the right side contains NULL values, the result of any FALSE becomes NULL
	if (ht.has_null) {
		for (idx_t i = 0; i < child.size(); i++) {
			if (!bool_result[i]) {
				mask.SetInvalid(i);
			}
		}
	}
}